

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

QOffscreenSurface * QRhiGles2InitParams::newFallbackSurface(QSurfaceFormat *format)

{
  long lVar1;
  bool bVar2;
  QOffscreenSurface *this;
  QOffscreenSurface *in_RDI;
  long in_FS_OFFSET;
  QOffscreenSurface *s;
  QOpenGLContext tempContext;
  QSurfaceFormat fmt;
  QSurfaceFormat *in_stack_ffffffffffffff88;
  QOpenGLContext *in_stack_ffffffffffffff90;
  QObject *in_stack_ffffffffffffff98;
  QOffscreenSurface *pQVar3;
  QObject *in_stack_ffffffffffffffa0;
  QScreen *in_stack_ffffffffffffffa8;
  char local_48 [32];
  QOffscreenSurface *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSurfaceFormat::QSurfaceFormat
            ((QSurfaceFormat *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QOpenGLContext::QOpenGLContext
            ((QOpenGLContext *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QOpenGLContext::setFormat(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar2 = QOpenGLContext::create((QOpenGLContext *)in_stack_ffffffffffffff98);
  if (bVar2) {
    QOpenGLContext::format((QOpenGLContext *)in_stack_ffffffffffffff98);
    QSurfaceFormat::operator=
              ((QSurfaceFormat *)in_stack_ffffffffffffffa0,
               (QSurfaceFormat *)in_stack_ffffffffffffff98);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)in_stack_ffffffffffffff90);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(char *)in_stack_ffffffffffffff88);
    QMessageLogger::warning(local_48,"QRhiGles2: Failed to create temporary context");
  }
  this = (QOffscreenSurface *)operator_new(0x28);
  QOffscreenSurface::QOffscreenSurface(in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pQVar3 = this;
  QOffscreenSurface::setFormat(this,in_stack_ffffffffffffff88);
  QOffscreenSurface::create(in_stack_ffffffffffffffd8);
  QOpenGLContext::~QOpenGLContext((QOpenGLContext *)this);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QOffscreenSurface *QRhiGles2InitParams::newFallbackSurface(const QSurfaceFormat &format)
{
    QSurfaceFormat fmt = format;

    // To resolve all fields in the format as much as possible, create a context.
    // This may be heavy, but allows avoiding BAD_MATCH on some systems.
    QOpenGLContext tempContext;
    tempContext.setFormat(fmt);
    if (tempContext.create())
        fmt = tempContext.format();
    else
        qWarning("QRhiGles2: Failed to create temporary context");

    QOffscreenSurface *s = new QOffscreenSurface;
    s->setFormat(fmt);
    s->create();

    return s;
}